

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O0

void __thiscall DObject::SerializeUserVars(DObject *this,FSerializer *arc)

{
  bool bVar1;
  PClass *pPVar2;
  FSerializer *arc_local;
  DObject *this_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    pPVar2 = GetClass(this);
    PClass::WriteAllFields(pPVar2,arc,this);
  }
  else {
    pPVar2 = GetClass(this);
    PClass::ReadAllFields(pPVar2,arc,this);
  }
  return;
}

Assistant:

void DObject::SerializeUserVars(FSerializer &arc)
{
	if (arc.isWriting())
	{
		// Write all fields that aren't serialized by native code.
		GetClass()->WriteAllFields(arc, this);
	}
	else
	{
		GetClass()->ReadAllFields(arc, this);
	}
}